

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
produce_begin_multi_dim
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          item_event_visitor *visitor,semantic_tag tag,error_code *ec)

{
  value_type *__src;
  value_type *pvVar1;
  assertion_error *this_00;
  undefined7 in_register_00000011;
  ulong __n;
  uint8_t b;
  undefined1 local_59;
  undefined4 local_58;
  string local_50;
  
  local_58 = (undefined4)CONCAT71(in_register_00000011,tag);
  __src = (this->source_).current_;
  pvVar1 = (this->source_).end_;
  __n = (ulong)(pvVar1 != __src);
  memcpy(&local_59,__src,__n);
  (this->source_).current_ = __src + __n;
  if (pvVar1 == __src) {
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
    return;
  }
  this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "assertion \'major_type == jsoncons::cbor::detail::cbor_major_type::array\' failed at  <> :0"
             ,"");
  assertion_error::assertion_error(this_00,&local_50);
  __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void produce_begin_multi_dim(item_event_visitor& visitor, 
                                 semantic_tag tag,
                                 std::error_code& ec)
    {
        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(b);
        JSONCONS_ASSERT(major_type == jsoncons::cbor::detail::cbor_major_type::array);
        uint8_t info = get_additional_information_value(b);
       
        read_shape(info, ec);   
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }

        state_stack_.emplace_back(parse_mode::multi_dim, 0);
        visitor.begin_multi_dim(shape_, tag, *this, ec);
        more_ = !cursor_mode_;
    }